

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O3

void gen_mtvsrdd(DisasContext_conflict10 *ctx)

{
  ushort uVar1;
  TCGContext_conflict10 *s;
  TCGTemp *a1;
  uintptr_t o;
  TCGv_i64 pTVar2;
  uint32_t excp;
  TCGOpcode opc;
  uint uVar3;
  uintptr_t o_2;
  TCGv_i64 pTVar4;
  
  s = ctx->uc->tcg_ctx;
  if ((ctx->opcode & 1) == 0) {
    if (ctx->vsx_enabled == false) {
      excp = 0x5e;
LAB_00bb7321:
      gen_exception(ctx,excp);
      return;
    }
  }
  else if (ctx->altivec_enabled == false) {
    excp = 0x49;
    goto LAB_00bb7321;
  }
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  pTVar4 = (TCGv_i64)((long)a1 - (long)s);
  uVar1 = *(ushort *)((long)&ctx->opcode + 2);
  if ((uVar1 & 0x1f) == 0) {
    opc = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
  }
  else {
    if (cpu_gpr[(ulong)uVar1 & 0x1f] == pTVar4) goto LAB_00bb7251;
    pTVar2 = (TCGv_i64)((long)&s->pool_cur + (long)cpu_gpr[(ulong)uVar1 & 0x1f]);
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_ppc64(s,opc,(TCGArg)a1,(TCGArg)pTVar2);
LAB_00bb7251:
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b28))
  ;
  uVar3 = ctx->opcode;
  pTVar2 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar3 >> 8 & 0xf8));
  if (pTVar2 != pTVar4) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)((long)&s->pool_cur + (long)pTVar2));
    uVar3 = ctx->opcode;
  }
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)((uVar3 >> 0x15 & 0x1f | (uVar3 & 1) << 5) * 0x10 + 0x12b20));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar4 + (long)s));
  return;
}

Assistant:

static void gen_mtvsrdd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0;
    if (xT(ctx->opcode) < 32) {
        if (unlikely(!ctx->vsx_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VSXU);
            return;
        }
    } else {
        if (unlikely(!ctx->altivec_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VPU);
            return;
        }
    }

    t0 = tcg_temp_new_i64(tcg_ctx);
    if (!rA(ctx->opcode)) {
        tcg_gen_movi_i64(tcg_ctx, t0, 0);
    } else {
        tcg_gen_mov_i64(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    }
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), t0);

    tcg_gen_mov_i64(tcg_ctx, t0, cpu_gpr[rB(ctx->opcode)]);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), t0);
    tcg_temp_free_i64(tcg_ctx, t0);
}